

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int set_add(void *av,void *t)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint local_5c;
  uint h;
  uint i;
  int n;
  int j;
  AbstractVec vv;
  AbstractVec *v;
  void *t_local;
  void *av_local;
  
  uVar1 = *av;
  if (uVar1 != 0) {
    i = 0;
    for (local_5c = (uint)t; local_5c = local_5c % uVar1, local_5c < *av && (int)i < 5;
        local_5c = local_5c + 1) {
      if (*(long *)(*(long *)((long)av + 8) + (ulong)local_5c * 8) == 0) {
        *(void **)(*(long *)((long)av + 8) + (ulong)local_5c * 8) = t;
        return 1;
      }
      if (*(void **)(*(long *)((long)av + 8) + (ulong)local_5c * 8) == t) {
        return 0;
      }
      i = i + 1;
    }
  }
  if (uVar1 == 0) {
    vv.n = 0;
    vv.i = 0;
    *(undefined4 *)((long)av + 4) = 2;
  }
  else {
    vv._0_8_ = *(undefined8 *)((long)av + 8);
    n = *av;
    *(int *)((long)av + 4) = *(int *)((long)av + 4) + 1;
  }
  *(uint *)av = d_prime2[*(uint *)((long)av + 4)];
  vv.e[2] = av;
  pvVar3 = malloc((ulong)*av << 3);
  *(void **)((long)vv.e[2] + 8) = pvVar3;
  memset(*(void **)((long)vv.e[2] + 8),0,(ulong)*vv.e[2] << 3);
  if (vv._0_8_ != 0) {
    set_union(av,&n);
    free((void *)vv._0_8_);
  }
  iVar2 = set_add(vv.e[2],t);
  return iVar2;
}

Assistant:

int set_add(void *av, void *t) {
  AbstractVec *v = (AbstractVec *)av, vv;
  int j, n = v->n;
  uint i;
  if (n) {
    uint h = ((uintptr_t)t);
    h = h % n;
    for (i = h, j = 0; i < v->n && j < SET_MAX_SEQUENTIAL; i = ((i + 1) % n), j++) {
      if (!v->v[i]) {
        v->v[i] = t;
        return 1;
      } else if (v->v[i] == t)
        return 0;
    }
  }
  if (!n) {
    vv.v = NULL;
    v->i = INITIAL_SET_SIZE_INDEX;
  } else {
    vv.v = v->v;
    vv.n = v->n;
    v->i = v->i + 1;
  }
  v->n = d_prime2[v->i];
  v->v = (void **)MALLOC(v->n * sizeof(void *));
  memset(v->v, 0, v->n * sizeof(void *));
  if (vv.v) {
    set_union(av, &vv);
    FREE(vv.v);
  }
  return set_add(v, t);
}